

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O2

bool initSoftHSM(void)

{
  bool bVar1;
  MutexFactory *this;
  SecureMemoryRegistry *pSVar2;
  CryptoFactory *pCVar3;
  Configuration *pCVar4;
  ConfigLoader *inConfigLoader;
  char *__ptr;
  size_t sStack_c0;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  this = MutexFactory::i();
  MutexFactory::disable(this);
  pSVar2 = SecureMemoryRegistry::i();
  if (pSVar2 == (SecureMemoryRegistry *)0x0) {
    __ptr = "ERROR: Could not initiate SecureMemoryRegistry.\n";
    sStack_c0 = 0x30;
  }
  else {
    pCVar3 = CryptoFactory::i();
    if (pCVar3 == (CryptoFactory *)0x0) {
      __ptr = "ERROR: Could not initiate CryptoFactory.\n";
      sStack_c0 = 0x29;
    }
    else {
      pCVar4 = Configuration::i();
      inConfigLoader = &SimpleConfigLoader::i()->super_ConfigLoader;
      bVar1 = Configuration::reload(pCVar4,inConfigLoader);
      if (bVar1) {
        pCVar4 = Configuration::i();
        std::__cxx11::string::string((string *)&local_28,"log.level",&local_a9);
        std::__cxx11::string::string((string *)&local_48,"INFO",&local_aa);
        Configuration::getString(&local_a8,pCVar4,&local_28,&local_48);
        bVar1 = setLogLevel(&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_28);
        if (bVar1) {
          pCVar4 = Configuration::i();
          std::__cxx11::string::string((string *)&local_68,"objectstore.backend",&local_a9);
          std::__cxx11::string::string((string *)&local_88,"file",&local_aa);
          Configuration::getString(&local_a8,pCVar4,&local_68,&local_88);
          bVar1 = ObjectStoreToken::selectBackend(&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_68);
          if (bVar1) {
            return true;
          }
          __ptr = "ERROR: Could not select token backend.\n";
          sStack_c0 = 0x27;
        }
        else {
          __ptr = "ERROR: Could not configure the log level.\n";
          sStack_c0 = 0x2a;
        }
      }
      else {
        __ptr = "ERROR: Could not load the SoftHSM configuration.\n";
        sStack_c0 = 0x31;
      }
    }
  }
  fwrite(__ptr,sStack_c0,1,_stderr);
  return false;
}

Assistant:

bool initSoftHSM()
{
	// Not using threading
	MutexFactory::i()->disable();

	// Initiate SecureMemoryRegistry
	if (SecureMemoryRegistry::i() == NULL)
	{
		fprintf(stderr, "ERROR: Could not initiate SecureMemoryRegistry.\n");
		return false;
	}

	// Build the CryptoFactory
	if (CryptoFactory::i() == NULL)
	{
		fprintf(stderr, "ERROR: Could not initiate CryptoFactory.\n");
		return false;
	}

#ifdef WITH_FIPS
	// Check the FIPS status
	if (!CryptoFactory::i()->getFipsSelfTestStatus())
	{
		fprintf(stderr, "ERROR: FIPS self test failed.\n");
		return false;
	}
#endif

	// Load the configuration
	if (!Configuration::i()->reload(SimpleConfigLoader::i()))
	{
		fprintf(stderr, "ERROR: Could not load the SoftHSM configuration.\n");
		return false;
	}

	// Configure the log level
	if (!setLogLevel(Configuration::i()->getString("log.level", DEFAULT_LOG_LEVEL)))
	{
		fprintf(stderr, "ERROR: Could not configure the log level.\n");
		return false;
	}

	// Configure object store storage backend used by all tokens.
	if (!ObjectStoreToken::selectBackend(Configuration::i()->getString("objectstore.backend", DEFAULT_OBJECTSTORE_BACKEND)))
	{
		fprintf(stderr, "ERROR: Could not select token backend.\n");
		return false;
	}

	return true;
}